

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcreateapproxspace.cpp
# Opt level: O1

void __thiscall
TPZCreateApproximationSpace::BuildMesh
          (TPZCreateApproximationSpace *this,TPZCompMesh *cmesh,TPZVec<long> *gelindexes)

{
  int num_of_blocks;
  TPZGeoMesh *pTVar1;
  TPZGeoEl *gel;
  TPZGeoEl **ppTVar2;
  TPZMaterial *pTVar3;
  ostream *poVar4;
  long lVar5;
  int matid;
  TPZVec<TPZGeoEl_*> elvec;
  set<int,_std::less<int>,_std::allocator<int>_> matnotfound;
  int local_8c;
  TPZCreateApproximationSpace *local_88;
  TPZVec<TPZGeoEl_*> local_80;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_88 = this;
  TPZVec<TPZGeoEl_*>::TPZVec(&local_80,gelindexes->fNElements);
  if (0 < gelindexes->fNElements) {
    pTVar1 = cmesh->fReference;
    lVar5 = 0;
    do {
      ppTVar2 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(pTVar1->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,
                           gelindexes->fStore[lVar5]);
      local_80.fStore[lVar5] = *ppTVar2;
      lVar5 = lVar5 + 1;
    } while (lVar5 < gelindexes->fNElements);
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  num_of_blocks = (int)(cmesh->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fNElements;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (num_of_blocks < 0) {
    TPZBlock::SetNBlocks(&cmesh->fBlock,0);
  }
  TPZBlock::SetNBlocks(&cmesh->fBlock,num_of_blocks);
  if (0 < local_80.fNElements) {
    lVar5 = 0;
    do {
      gel = local_80.fStore[lVar5];
      if ((gel != (TPZGeoEl *)0x0) && (gel->fReference == (TPZCompEl *)0x0)) {
        local_8c = gel->fMatId;
        pTVar3 = TPZCompMesh::FindMaterial(cmesh,local_8c);
        if (pTVar3 == (TPZMaterial *)0x0) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &local_60,&local_8c);
        }
        else if (((gel->fReference == (TPZCompEl *)0x0) && (gel->fNumInterfaces == 0)) &&
                (CreateCompEl(local_88,gel,cmesh), local_88->fCreateHybridMesh == true)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"TPZChunkVector::operator[]. ",0x1c);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Bad parameter nelem.",0x14);
          poVar4 = std::ostream::_M_insert<long>((long)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," NElements ",0xb);
          poVar4 = std::ostream::_M_insert<long>((long)poVar4);
          std::endl<char,std::char_traits<char>>(poVar4);
          std::ostream::flush();
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Util/TPZChunkVector.h"
                     ,0x17d);
        }
      }
      lVar5 = lVar5 + 1;
    } while (local_80.fNElements != lVar5);
  }
  TPZCompMesh::InitializeBlock(cmesh);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  local_80._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b770;
  if (local_80.fStore != (TPZGeoEl **)0x0) {
    operator_delete__(local_80.fStore);
  }
  return;
}

Assistant:

void TPZCreateApproximationSpace::BuildMesh(TPZCompMesh &cmesh, const TPZVec<int64_t> &gelindexes) const {
    TPZVec<TPZGeoEl *> elvec(gelindexes.size());
    TPZGeoMesh *gmesh = cmesh.Reference();
    for(int64_t el = 0; el<gelindexes.size(); el++)
    {
        elvec[el] = gmesh->Element(gelindexes[el]);
    }
	int64_t i, nelem = elvec.NElements();
	int64_t neltocreate = 0;
	int64_t index;
	for(i=0; i<nelem; i++) {
		TPZGeoEl *gel = elvec[i];
		if(!gel) continue;
        if (gel->Reference()) {
            continue;
        }
	}
	std::set<int> matnotfound;
	int64_t nbl = cmesh.Block().NBlocks();
    if(neltocreate > nbl) 
    {
        cmesh.Block().SetNBlocks(neltocreate);
    }
    cmesh.Block().SetNBlocks(nbl);
	
	for(i=0; i<nelem; i++) {
		TPZGeoEl *gel = elvec[i];
		if(!gel || gel->Reference()) continue;
        int matid = gel->MaterialId();
        TPZMaterial * mat = cmesh.FindMaterial(matid);
        if(!mat)
        {
            matnotfound.insert(matid);
            continue;
        }
        
        if(!gel->Reference() && gel->NumInterfaces() == 0)
        {
            CreateCompEl(gel,cmesh);
            if (fCreateHybridMesh) {
                cmesh.ElementVec()[index]->Reference()->ResetReference();
            }
#ifdef PZ_LOG
            if (logger.isDebugEnabled())
            {

                std::stringstream sout;
                if (index < 0) {
                    if(gel->Dimension() == 0){
                        sout << "Zero dimensional element, is your approximation space Hdiv?. " << std::endl;
                        gel->Print(sout);
                        sout << "No computational element was created. " << std::endl;
                    }
                }else{
                    cmesh.ElementVec()[index]->Print(sout);
                }
                LOGPZ_DEBUG(logger, sout.str())
            }
#endif
        }
	}
	cmesh.InitializeBlock();
}